

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgDisplay * __thiscall
cimg_library::CImgDisplay::resize(CImgDisplay *this,int nwidth,int nheight,bool force_redraw)

{
  Display *pDVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  CImgDisplay *pCVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint ndimx;
  bool bVar9;
  bool bVar10;
  timeval st_time;
  XWindowAttributes attr;
  timespec local_c8;
  undefined1 local_b8 [8];
  uint local_b0;
  uint local_ac;
  
  if (nheight != 0 && nwidth != 0) {
    bVar9 = this->_width == 0;
    bVar10 = this->_height == 0;
    if (-1 < (nheight | nwidth) || !bVar10 && !bVar9) {
      if (bVar10 || bVar9) {
        this = assign(this,nwidth,nheight,(char *)0x0,3,false,false);
      }
      else {
        if ((cimg::X11_attr()::val == '\0') &&
           (iVar7 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar7 != 0)) {
          cimg::X11_static::X11_static(&cimg::X11_attr::val);
          __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
          __cxa_guard_release(&cimg::X11_attr()::val);
        }
        pDVar1 = cimg::X11_attr::val.display;
        if (nwidth < 1) {
          nwidth = (int)-(nwidth * this->_width) / 100;
        }
        if (nheight < 1) {
          nheight = (int)-(nheight * this->_height) / 100;
        }
        ndimx = nwidth + (uint)(nwidth == 0);
        uVar8 = nheight + (uint)(nheight == 0);
        if ((((this->_width != ndimx) || (this->_height != uVar8)) || (this->_window_width != ndimx)
            ) || (this->_window_height != uVar8)) {
          show(this);
          if (cimg::Mutex_attr()::val == '\0') {
            resize();
          }
          pthread_mutex_lock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 600));
          if ((this->_window_width != ndimx) || (this->_window_height != uVar8)) {
            iVar7 = 10;
            do {
              XResizeWindow(pDVar1,this->_window,ndimx,uVar8);
              XGetWindowAttributes(pDVar1,this->_window,local_b8);
              if ((local_b0 == ndimx) && (local_ac == uVar8)) break;
              if (this->_timer == 0) {
                gettimeofday((timeval *)&local_c8,(__timezone_ptr_t)0x0);
                this->_timer = local_c8.tv_sec * 1000 + local_c8.tv_nsec / 1000;
              }
              gettimeofday((timeval *)&local_c8,(__timezone_ptr_t)0x0);
              uVar6 = local_c8.tv_sec * 1000 + local_c8.tv_nsec / 1000;
              uVar3 = this->_timer + 5;
              uVar4 = uVar3 - uVar6;
              if (uVar3 < uVar6 || uVar4 == 0) {
                this->_timer = uVar6;
              }
              else {
                uVar3 = uVar4 & 0xffffffff;
                this->_timer = uVar6 + uVar3;
                local_c8.tv_sec = uVar3 / 1000;
                local_c8.tv_nsec =
                     (long)(uint)(((int)uVar4 + (int)(uVar3 / 1000) * -1000) * 1000000);
                nanosleep(&local_c8,(timespec *)0x0);
              }
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          if ((this->_width != ndimx) || (this->_height != uVar8)) {
            if ((cimg::X11_attr()::val == '\0') &&
               (iVar7 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar7 != 0)) {
              cimg::X11_static::X11_static(&cimg::X11_attr::val);
              __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
              __cxa_guard_release(&cimg::X11_attr()::val);
            }
            if (cimg::X11_attr::val.nb_bits == 0x10) {
              _resize<unsigned_short>(this,0,ndimx,uVar8,force_redraw);
            }
            else if (cimg::X11_attr::val.nb_bits == 8) {
              _resize<unsigned_char>(this,'\0',ndimx,uVar8,force_redraw);
            }
            else {
              _resize<unsigned_int>(this,0,ndimx,uVar8,force_redraw);
            }
          }
          this->_width = ndimx;
          this->_window_width = ndimx;
          this->_height = uVar8;
          this->_window_height = uVar8;
          if (cimg::Mutex_attr()::val == '\0') {
            resize();
          }
          pthread_mutex_unlock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 600));
        }
        this->_is_resized = false;
        if (this->_is_fullscreen == true) {
          iVar7 = screen_width();
          uVar8 = this->_width;
          iVar2 = screen_height();
          move(this,iVar7 - uVar8 >> 1,iVar2 - this->_height >> 1);
        }
        if (force_redraw) {
          this = paint(this,true);
        }
      }
      return this;
    }
  }
  pCVar5 = assign(this);
  return pCVar5;
}

Assistant:

CImgDisplay& resize(const int nwidth, const int nheight, const bool force_redraw=true) {
      if (!nwidth || !nheight || (is_empty() && (nwidth<0 || nheight<0))) return assign();
      if (is_empty()) return assign(nwidth,nheight);
      Display *const dpy = cimg::X11_attr().display;
      const unsigned int
        tmpdimx = (nwidth>0)?nwidth:(-nwidth*width()/100),
        tmpdimy = (nheight>0)?nheight:(-nheight*height()/100),
        dimx = tmpdimx?tmpdimx:1,
        dimy = tmpdimy?tmpdimy:1;
      if (_width!=dimx || _height!=dimy || _window_width!=dimx || _window_height!=dimy) {
        show();
        cimg_lock_display();
        if (_window_width!=dimx || _window_height!=dimy) {
          XWindowAttributes attr;
          for (unsigned int i = 0; i<10; ++i) {
            XResizeWindow(dpy,_window,dimx,dimy);
            XGetWindowAttributes(dpy,_window,&attr);
            if (attr.width==(int)dimx && attr.height==(int)dimy) break;
            cimg::wait(5,&_timer);
          }
        }
        if (_width!=dimx || _height!=dimy) switch (cimg::X11_attr().nb_bits) {
          case 8 :  { unsigned char pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
          case 16 : { unsigned short pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); } break;
          default : { unsigned int pixel_type = 0; _resize(pixel_type,dimx,dimy,force_redraw); }
          }
        _window_width = _width = dimx; _window_height = _height = dimy;
        cimg_unlock_display();
      }
      _is_resized = false;
      if (_is_fullscreen) move((screen_width() - _width)/2,(screen_height() - _height)/2);
      if (force_redraw) return paint();
      return *this;
    }